

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxPropertyName.cpp
# Opt level: O2

void __thiscall Jinx::Impl::PropertyName::Read(PropertyName *this,BinaryReader *reader)

{
  BinaryReader::Read(reader,&this->m_id);
  BinaryReader::Read(reader,&this->m_readOnly);
  BinaryReader::Read(reader,&this->m_name);
  BinaryReader::Read<Jinx::Impl::VisibilityType,unsigned_char>(reader,&this->m_visibility);
  BinaryReader::Read<unsigned_long,unsigned_short>(reader,&this->m_partCount);
  Jinx::Variant::Read(&this->m_defaultValue,reader);
  return;
}

Assistant:

inline_t void PropertyName::Read(BinaryReader & reader)
	{
		reader.Read(&m_id);
		reader.Read(&m_readOnly);
		reader.Read(&m_name);
		reader.Read<VisibilityType, uint8_t>(&m_visibility);
		reader.Read<size_t, uint16_t>(&m_partCount);
		m_defaultValue.Read(reader);
	}